

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BG_FactorGraphCreator.cpp
# Opt level: O2

void __thiscall
BG_FactorGraphCreator::Construct_AgentBGPolicy_Variables(BG_FactorGraphCreator *this)

{
  int iVar1;
  Index IVar2;
  uint ag;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LIndex i;
  Var v;
  value_type local_30;
  
  iVar1 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            (&this->_m_vars,CONCAT44(extraout_var,iVar1));
  ag = 0;
  while( true ) {
    iVar1 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
    if (CONCAT44(extraout_var_00,iVar1) <= (ulong)ag) break;
    i = BayesianGameBase::GetNrPolicies((BayesianGameBase *)(this->_m_bg).px,ag);
    IVar2 = Globals::CastLIndexToIndex(i);
    local_30._states = (size_t)IVar2;
    local_30._label = (ulong)ag;
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back(&this->_m_vars,&local_30);
    ag = ag + 1;
  }
  return;
}

Assistant:

void BG_FactorGraphCreator::Construct_AgentBGPolicy_Variables()
{   
    _m_vars.reserve( _m_bg->GetNrAgents() );

    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
    {
        libDAI::Var v(agI, CastLIndexToIndex(_m_bg->GetNrPolicies(agI)));
        _m_vars.push_back(v);
    }
}